

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::MemoryHeap::MemoryHeap
          (MemoryHeap *this,VkMemoryHeap *heap,
          vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
          *memoryTypes,PlatformMemoryLimits *memoryLimits,VkDeviceSize nonCoherentAtomSize,
          TotalMemoryTracker *totalMemTracker)

{
  VkMemoryHeapFlags VVar1;
  undefined4 uVar2;
  VkDeviceSize VVar3;
  TotalMemoryTracker *totalMemTracker_local;
  VkDeviceSize nonCoherentAtomSize_local;
  PlatformMemoryLimits *memoryLimits_local;
  vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
  *memoryTypes_local;
  VkMemoryHeap *heap_local;
  MemoryHeap *this_local;
  
  VVar1 = heap->flags;
  uVar2 = *(undefined4 *)&heap->field_0xc;
  (this->m_heap).size = heap->size;
  (this->m_heap).flags = VVar1;
  *(undefined4 *)&(this->m_heap).field_0xc = uVar2;
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
  ::vector(&this->m_memoryTypes,memoryTypes);
  this->m_limits = memoryLimits;
  this->m_nonCoherentAtomSize = nonCoherentAtomSize;
  VVar3 = getMinAtomSize(nonCoherentAtomSize,memoryTypes);
  this->m_minAtomSize = VVar3;
  this->m_totalMemTracker = totalMemTracker;
  this->m_usage = 0;
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
  ::vector(&this->m_objects);
  return;
}

Assistant:

MemoryHeap (const VkMemoryHeap&			heap,
				const vector<MemoryType>&	memoryTypes,
				const PlatformMemoryLimits&	memoryLimits,
				const VkDeviceSize			nonCoherentAtomSize,
				TotalMemoryTracker&			totalMemTracker)
		: m_heap				(heap)
		, m_memoryTypes			(memoryTypes)
		, m_limits				(memoryLimits)
		, m_nonCoherentAtomSize	(nonCoherentAtomSize)
		, m_minAtomSize			(getMinAtomSize(nonCoherentAtomSize, memoryTypes))
		, m_totalMemTracker		(totalMemTracker)
		, m_usage				(0)
	{
	}